

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this)

{
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this_01;
  int opcode;
  LogicalExpr LVar2;
  LogicalExpr LVar3;
  double dVar4;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  switch(*pcVar1) {
  case 'l':
  case 'n':
  case 's':
    this_01 = this->handler_;
    dVar4 = ReadConstant(this,*pcVar1);
    LVar2 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnBool
                      (this_01,(bool)(-(dVar4 != 0.0) & 1));
    return (LogicalExpr)LVar2.super_ExprBase.impl_;
  default:
    TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x2c010e);
    return (LogicalExpr)(Impl *)0x0;
  case 'o':
    opcode = ReadOpCode(this);
    LVar3 = ReadLogicalExpr(this,opcode);
    return (LogicalExpr)LVar3.super_ExprBase.impl_;
  }
}

Assistant:

typename Handler::LogicalExpr NLReader<Reader, Handler>::ReadLogicalExpr() {
  switch (char c = reader_.ReadChar()) {
  case 'n': case 'l': case 's':
    return handler_.OnBool(ReadConstant(c) != 0);
  case 'o':
    return ReadLogicalExpr(ReadOpCode());
  }
  reader_.ReportError("expected logical expression");
  return LogicalExpr();
}